

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::PlatformInfoGen12::OverrideCompressionFormat
          (PlatformInfoGen12 *this,GMM_RESOURCE_FORMAT Format,uint8_t IsMC)

{
  uint uVar1;
  SKU_FEATURE_TABLE *pSVar2;
  byte local_16;
  uint8_t CompressionFormat;
  uint8_t IsMC_local;
  GMM_RESOURCE_FORMAT Format_local;
  PlatformInfoGen12 *this_local;
  
  local_16 = (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
             FormatTable[Format].CompressionFormat.CompressionFormat;
  pSVar2 = Context::GetSkuTable
                     ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.
                      pGmmLibContext);
  if (((ulong)pSVar2->field_1 >> 0x22 & 1) == 0) {
    pSVar2 = Context::GetSkuTable
                       ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.
                        pGmmLibContext);
    if ((((ulong)pSVar2->field_1 >> 0x19 & 1) != 0) ||
       (pSVar2 = Context::GetSkuTable
                           ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.
                            super_PlatformInfo.pGmmLibContext),
       ((ulong)pSVar2->field_1 >> 0x1e & 1) != 0)) {
      if ((IsMC == '\0') &&
         ((pSVar2 = Context::GetSkuTable
                              ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.
                               super_PlatformInfo.pGmmLibContext),
          ((ulong)pSVar2->field_1 >> 0x1e & 1) == 0 && (7 < local_16)))) {
        local_16 = 0x30;
      }
      if (((IsMC == '\0') &&
          (pSVar2 = Context::GetSkuTable
                              ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.
                               super_PlatformInfo.pGmmLibContext),
          ((ulong)pSVar2->field_1 >> 0x1e & 1) != 0)) && (0x1f < local_16)) {
        local_16 = 0x30;
      }
      else if (IsMC != '\0') {
        pSVar2 = Context::GetSkuTable
                           ((this->super_PlatformInfoGen11).super_PlatformInfoGen10.
                            super_PlatformInfo.pGmmLibContext);
        if (((ulong)pSVar2->field_1 >> 0x1e & 1) == 0) {
          if ((local_16 < 0x21) || (0x2f < local_16)) {
            if (local_16 == 0) {
              local_16 = 0x21;
            }
            else if (local_16 == 2) {
              local_16 = 0x2a;
            }
            else if (local_16 == 3) {
              local_16 = 0x2e;
            }
            else if ((local_16 < 0x21) || (0x2f < local_16)) {
              local_16 = 0x30;
            }
            if (local_16 != 0x30) {
              local_16 = local_16 - 0x20;
            }
          }
          else {
            local_16 = local_16 - 0x20;
          }
        }
        else if ((local_16 < 0x21) || (0x2f < local_16)) {
          uVar1 = (uint)local_16;
          if (uVar1 - 4 < 2) {
            local_16 = 0x21;
          }
          else if (uVar1 - 8 < 2) {
            local_16 = 0x2a;
          }
          else if (uVar1 == 0xc) {
            local_16 = 0x2e;
          }
          else if ((local_16 < 0x21) || (0x2f < local_16)) {
            local_16 = 0x30;
          }
          if (local_16 != 0x30) {
            local_16 = local_16 - 0x20;
          }
        }
        else {
          local_16 = local_16 - 0x20;
        }
      }
    }
  }
  else if (0xf < local_16) {
    local_16 = 0x10;
  }
  return local_16;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen12::OverrideCompressionFormat(GMM_RESOURCE_FORMAT Format, uint8_t IsMC)
{

    uint8_t CompressionFormat = Data.FormatTable[Format].CompressionFormat.CompressionFormat;
    if (pGmmLibContext->GetSkuTable().FtrXe2Compression)
    {
        if ((CompressionFormat < GMM_XE2_UNIFIED_COMP_MIN_FORMAT) ||
            (CompressionFormat > GMM_XE2_UNIFIED_COMP_MAX_FORMAT))
        {
            CompressionFormat = GMM_XE2_UNIFIED_COMP_FORMAT_INVALID;
        }
        __GMM_ASSERT(CompressionFormat != GMM_XE2_UNIFIED_COMP_FORMAT_INVALID);
    }
    else if (pGmmLibContext->GetSkuTable().FtrFlatPhysCCS || pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats)
    {
        if(!IsMC &&
           !pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats &&
           (CompressionFormat < GMM_FLATCCS_MIN_RC_FORMAT ||
            CompressionFormat > GMM_FLATCCS_MAX_RC_FORMAT))
        {
            CompressionFormat = GMM_FLATCCS_FORMAT_INVALID;
        }

	if(!IsMC &&
           pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats &&
           (CompressionFormat < GMM_UNIFIED_COMP_MIN_RC_FORMAT ||
            CompressionFormat > GMM_UNIFIED_COMP_MAX_RC_FORMAT))
        {
            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_INVALID;
        }
	else if(IsMC)
        {
            if(!pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats)
            {
		if(CompressionFormat >= GMM_FLATCCS_MIN_MC_FORMAT && CompressionFormat <= GMM_FLATCCS_MAX_MC_FORMAT)
                {
                    //True MC format encodings, drop MC-identify bit (ie bit5)
                    CompressionFormat -= (GMM_FLATCCS_MIN_MC_FORMAT - 1);
                }
                else
                {
                    // RC format encoding, needs MC format encoding for MC usage
                    switch(CompressionFormat)
                    {
                        case GMM_FLATCCS_FORMAT_RGB10A2:
                            CompressionFormat = GMM_FLATCCS_FORMAT_RGB10b;
                            break;
                        case GMM_FLATCCS_FORMAT_RGBA16U:
                            CompressionFormat = GMM_FLATCCS_FORMAT_RGBA16_MEDIA;
                            break;
                        case GMM_FLATCCS_FORMAT_RGBA8U:
                            CompressionFormat = GMM_FLATCCS_FORMAT_ARGB8b;
                            break;
                        default:
                            if(CompressionFormat < GMM_FLATCCS_MIN_MC_FORMAT || CompressionFormat > GMM_FLATCCS_MAX_MC_FORMAT)
                            {
                                CompressionFormat = GMM_FLATCCS_FORMAT_INVALID;
                            }
                            break;
                    }

                    if(CompressionFormat != GMM_FLATCCS_FORMAT_INVALID)
                    {
                        //drop MC-identify bit (ie bit 5)
                        CompressionFormat -= (GMM_FLATCCS_MIN_MC_FORMAT - 1);
                    }
                }
	    }
            else
            {
                if(CompressionFormat >= GMM_UNIFIED_COMP_MIN_MC_FORMAT && CompressionFormat <= GMM_UNIFIED_COMP_MAX_MC_FORMAT)
                {
                    //True MC format encodings, drop MC-identify bit (ie bit5)
                    CompressionFormat -= (GMM_UNIFIED_COMP_MIN_MC_FORMAT - 1);
                }
                else
                {
                    // RC format encoding, needs MC format encoding for MC usage
                    switch(CompressionFormat)
                    {
                        case GMM_UNIFIED_COMP_FORMAT_RGB10A2:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_RGB10b;
                            break;
                        case GMM_UNIFIED_COMP_FORMAT_RGBA16U:
                        case GMM_UNIFIED_COMP_FORMAT_RGBA16F:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_RGBA16_MEDIA;
                            break;
                        case GMM_UNIFIED_COMP_FORMAT_RGBA8U:
                        case GMM_UNIFIED_COMP_FORMAT_RGBA8S:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_ARGB8b;
                            break;
                        default:
                            if(CompressionFormat < GMM_UNIFIED_COMP_MIN_MC_FORMAT || CompressionFormat > GMM_UNIFIED_COMP_MAX_MC_FORMAT)
                            {
                                CompressionFormat = GMM_UNIFIED_COMP_FORMAT_INVALID;
                            }
                            break;
                    }

                    if(CompressionFormat != GMM_UNIFIED_COMP_FORMAT_INVALID)
                    {
                        //drop MC-identify bit (ie bit 5)
                        CompressionFormat -= (GMM_UNIFIED_COMP_MIN_MC_FORMAT - 1);
                    }
		}
	    }
        }

	//Assert if out of MC/RC encoding range -ie format-table must be corrected for Compression code
        __GMM_ASSERT(!pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats && CompressionFormat != GMM_FLATCCS_FORMAT_INVALID ||
                     pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats && CompressionFormat != GMM_UNIFIED_COMP_FORMAT_INVALID);
    }

    return CompressionFormat;
}